

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall t_cpp_generator::close_generator(t_cpp_generator *this)

{
  ostream *poVar1;
  t_program *program;
  char *__filename;
  int __fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string f_types_impl_name;
  string local_30;
  t_cpp_generator *local_10;
  t_cpp_generator *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&this->ns_close_);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)&this->f_types_impl_,(string *)&this->ns_close_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)&this->f_types_tcc_,(string *)&this->ns_close_);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  if ((this->gen_templates_ & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&this->f_types_,"#include \"");
    program = t_generator::get_program((t_generator *)this);
    get_include_prefix_abi_cxx11_(&local_30,this,program);
    poVar1 = std::operator<<(poVar1,(string *)&local_30);
    poVar1 = std::operator<<(poVar1,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar1 = std::operator<<(poVar1,"_types.tcc\"");
    poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_30);
  }
  poVar1 = std::operator<<((ostream *)&this->f_types_,"#endif");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)&this->f_types_tcc_,"#endif");
  __fd = 0x56b700;
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_impl_,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_tcc_,__fd);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  std::operator+(&local_80,&local_a0,&(this->super_t_oop_generator).super_t_generator.program_name_)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_80,"_types.cpp");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((this->has_members_ & 1U) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void t_cpp_generator::close_generator() {
  // Close namespace
  f_types_ << ns_close_ << endl << endl;
  f_types_impl_ << ns_close_ << endl;
  f_types_tcc_ << ns_close_ << endl << endl;

  // Include the types.tcc file from the types header file,
  // so clients don't have to explicitly include the tcc file.
  // TODO(simpkins): Make this a separate option.
  if (gen_templates_) {
    f_types_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
             << "_types.tcc\"" << endl << endl;
  }

  // Close ifndef
  f_types_ << "#endif" << endl;
  f_types_tcc_ << "#endif" << endl;

  // Close output file
  f_types_.close();
  f_types_impl_.close();
  f_types_tcc_.close();

  string f_types_impl_name = get_out_dir() + program_name_ + "_types.cpp";

  if (!has_members_) {
    remove(f_types_impl_name.c_str());
  }
}